

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O0

void __thiscall
POSGDiscrete::POSGDiscrete(POSGDiscrete *this,void **vtt,string *name,string *descr,string *pf)

{
  vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *this_00;
  size_t in_RDX;
  POSG *in_RSI;
  long *in_RDI;
  size_t nrAgents;
  void **in_stack_ffffffffffffff68;
  POSG *in_stack_ffffffffffffff70;
  allocator_type *__a;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  void **in_stack_ffffffffffffffa8;
  MultiAgentDecisionProcessDiscrete *in_stack_ffffffffffffffb0;
  POSG *this_01;
  
  this_01 = in_RSI;
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,(string *)in_RSI);
  POSG::POSG(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  *in_RDI = *(long *)in_RSI;
  *(size_type *)((long)in_RDI + *(long *)(*in_RDI + -0x50)) = *(size_type *)(in_RSI + 1);
  *(size_type *)((long)in_RDI + *(long *)(*in_RDI + -0x48)) =
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
         *)&in_RSI[1]._m_initialized)->_M_allocated_capacity;
  *(size_t *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) = in_RSI[1]._m_nrAgents;
  *(pointer *)((long)in_RDI + *(long *)(*in_RDI + -0x58)) =
       in_RSI[1]._m_discount.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  in_RDI[0x40] = (long)in_RSI[1]._m_discount.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  __a = (allocator_type *)(in_RDI + 0x4a);
  std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::vector
            ((vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *)0xadc092);
  *(undefined1 *)(in_RDI + 0x49) = 0;
  this_00 = (vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *)
            (**(code **)(*in_RDI + 0x10))();
  POSG::SetNrAgents(this_01,in_RDX);
  POSG::SetInitialized(in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  std::allocator<RewardModelMapping_*>::allocator((allocator<RewardModelMapping_*> *)0xadc109);
  std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::vector
            ((vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *)in_RSI,
             (size_type)in_RDI,(value_type *)this_00,__a);
  std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::operator=
            (this_00,(vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *)__a);
  std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::~vector(this_00);
  std::allocator<RewardModelMapping_*>::~allocator((allocator<RewardModelMapping_*> *)0xadc14d);
  return;
}

Assistant:

POSGDiscrete::POSGDiscrete(
    const string &name, const string &descr, const string &pf) :
    MultiAgentDecisionProcessDiscrete(name, descr, pf)
{
    _m_initialized = false;
    size_t nrAgents = GetNrAgents();
    POSG::SetNrAgents(nrAgents);
    POSG::SetInitialized(true);
    _m_p_rModel = vector<RewardModelMapping*>(nrAgents, 0);

}